

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockCallTest.cpp
# Opt level: O0

void __thiscall
TEST_MockCallTest_expectAMultiCallThatDoesntHappenTheExpectedTimes_Test::testBody
          (TEST_MockCallTest_expectAMultiCallThatDoesntHappenTheExpectedTimes_Test *this)

{
  int iVar1;
  uint uVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  TestTerminator *pTVar5;
  SimpleString local_88;
  SimpleString local_78;
  SimpleString local_68;
  SimpleString local_58;
  long *local_48;
  MockCheckedActualCall *actualCall;
  SimpleString local_20;
  TEST_MockCallTest_expectAMultiCallThatDoesntHappenTheExpectedTimes_Test *local_10;
  TEST_MockCallTest_expectAMultiCallThatDoesntHappenTheExpectedTimes_Test *this_local;
  
  local_10 = this;
  SimpleString::SimpleString(&local_20,"");
  pMVar3 = mock(&local_20,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)&actualCall,"func");
  (*pMVar3->_vptr_MockSupport[5])(pMVar3,2,&actualCall);
  SimpleString::~SimpleString((SimpleString *)&actualCall);
  SimpleString::~SimpleString(&local_20);
  SimpleString::SimpleString(&local_58,"");
  pMVar3 = mock(&local_58,(MockFailureReporter *)0x0);
  SimpleString::SimpleString(&local_68,"func");
  iVar1 = (*pMVar3->_vptr_MockSupport[6])(pMVar3,&local_68);
  SimpleString::~SimpleString(&local_68);
  SimpleString::~SimpleString(&local_58);
  local_48 = (long *)CONCAT44(extraout_var,iVar1);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x188))();
  pUVar4 = UtestShell::getCurrent();
  SimpleString::SimpleString(&local_78,"");
  pMVar3 = mock(&local_78,(MockFailureReporter *)0x0);
  uVar2 = (*pMVar3->_vptr_MockSupport[0x26])();
  pTVar5 = UtestShell::getCurrentTestTerminator();
  (*pUVar4->_vptr_UtestShell[8])
            (pUVar4,(ulong)(uVar2 & 1),"CHECK","mock().expectedCallsLeft()",0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockCallTest.cpp"
             ,0x52,pTVar5);
  SimpleString::~SimpleString(&local_78);
  SimpleString::SimpleString(&local_88,"");
  pMVar3 = mock(&local_88,(MockFailureReporter *)0x0);
  (*pMVar3->_vptr_MockSupport[0x27])();
  SimpleString::~SimpleString(&local_88);
  return;
}

Assistant:

TEST(MockCallTest, expectAMultiCallThatDoesntHappenTheExpectedTimes)
{
    mock().expectNCalls(2, "func");
    MockCheckedActualCall& actualCall = (MockCheckedActualCall&) mock().actualCall("func");
    actualCall.checkExpectations();
    CHECK(mock().expectedCallsLeft());
    mock().clear();
}